

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_quiet_result_printer.hpp
# Opt level: O0

TestEventListener * iuutil::QuietResultPrinter::SetUp(void)

{
  UnitTest *this;
  TestEventListeners *this_00;
  TestEventListener *pTVar1;
  TestEventListener *p;
  TestEventListener *default_printer;
  TestEventListeners *listeners;
  
  this = iutest::UnitTest::GetInstance();
  this_00 = iutest::UnitTest::listeners(this);
  pTVar1 = iutest::TestEventListeners::default_result_printer(this_00);
  pTVar1 = iutest::TestEventListeners::Release(this_00,pTVar1);
  if (pTVar1 == (TestEventListener *)0x0) {
    listeners = (TestEventListeners *)0x0;
  }
  else {
    listeners = (TestEventListeners *)operator_new(0x10);
    QuietResultPrinter((QuietResultPrinter *)listeners,pTVar1);
    iutest::TestEventListeners::Append(this_00,(TestEventListener *)listeners);
  }
  return (TestEventListener *)listeners;
}

Assistant:

static ::iutest::TestEventListener* SetUp()
    {
        ::iutest::TestEventListeners& listeners = ::iutest::UnitTest::GetInstance()->listeners();
        ::iutest::TestEventListener* default_printer = listeners.Release(listeners.default_result_printer());
        if( default_printer == NULL )
        {
            return NULL;
        }
        ::iutest::TestEventListener* p = new QuietResultPrinter(default_printer);
        listeners.Append(p);
        return p;
    }